

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall
ft::list<int,_ft::allocator<int>_>::split
          (list<int,_ft::allocator<int>_> *this,list<int,_ft::allocator<int>_> *first,
          list<int,_ft::allocator<int>_> *second)

{
  long lVar1;
  undefined **local_28;
  listNode<int> *local_20;
  undefined **local_18;
  node *local_10;
  
  local_20 = first->m_head;
  lVar1 = (first->m_size >> 1) + 1;
  do {
    local_20 = local_20->next;
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  local_28 = &PTR__listIterator_0010dd60;
  local_10 = first->m_tail;
  local_18 = &PTR__listIterator_0010dd60;
  splice(second,(int)&stack0xffffffffffffffc8,(__off64_t *)first,(int)&local_28,
         (__off64_t *)&local_18,0x10dd60,0x10dd60);
  return;
}

Assistant:

void split(list & first, list & second) {
		iterator	it(first.begin());
		for (size_type i = 0; i < first.size() / 2; ++i)
			++it;
		second.splice(second.begin(), first, it, first.end());
	}